

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O2

void ecs_delete_table(ecs_world_t *world,ecs_table_t *table)

{
  ulong index;
  ecs_query_event_t local_38;
  
  local_38.kind = EcsQueryTableUnmatch;
  local_38.parent_query = (ecs_query_t *)0x0;
  local_38.table = table;
  ecs_notify_queries(world,&local_38);
  index = (ulong)table->id;
  ecs_table_free(world,table);
  _ecs_assert(index != 0,0xc,(char *)0x0,"id != 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x44a);
  if (index != 0) {
    ecs_sparse_remove((world->store).tables,index);
    ecs_sparse_set_generation((world->store).tables,index);
    return;
  }
  __assert_fail("id != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x44a,"void ecs_delete_table(ecs_world_t *, ecs_table_t *)");
}

Assistant:

void ecs_delete_table(
    ecs_world_t *world,
    ecs_table_t *table)
{
    /* Notify queries that table is to be removed */
    ecs_notify_queries(
        world, &(ecs_query_event_t){
            .kind = EcsQueryTableUnmatch,
            .table = table
        });

    uint32_t id = table->id;

    /* Free resources associated with table */
    ecs_table_free(world, table);

    /* Remove table from sparse set */
    ecs_assert(id != 0, ECS_INTERNAL_ERROR, NULL);
    ecs_sparse_remove(world->store.tables, id);

    /* Don't do generations as we want table ids to remain 32 bit */
    ecs_sparse_set_generation(world->store.tables, id);
}